

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O1

void __thiscall
duckdb::InternalApproxTopKState::InsertOrReplaceEntry
          (InternalApproxTopKState *this,ApproxTopKString *input,AggregateInputData *aggr_input,
          idx_t increment)

{
  pointer *pprVar1;
  iterator __position;
  _Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_> _Var2
  ;
  ApproxTopKValue *value;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  reference_wrapper<duckdb::ApproxTopKValue> local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  hash_t local_48;
  ApproxTopKValue *local_40;
  
  __position._M_current =
       (this->values).
       super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)__position._M_current -
          (long)(this->values).
                super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar4 < this->capacity) {
    _Var2.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
         (this->stored_values).
         super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
         .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>;
    local_58._M_data =
         (ApproxTopKValue *)
         ((long)_Var2.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl +
         uVar4 * 0x38);
    *(ulong *)((long)_Var2.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl + 8
              + uVar4 * 0x38) = uVar4;
    if (__position._M_current ==
        (this->values).
        super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::reference_wrapper<duckdb::ApproxTopKValue>,std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::ApproxTopKValue>>
                ((vector<std::reference_wrapper<duckdb::ApproxTopKValue>,std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>>>
                  *)&this->values,__position,&local_58);
    }
    else {
      (__position._M_current)->_M_data = local_58._M_data;
      pprVar1 = &(this->values).
                 super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
  }
  value = (this->values).
          super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  uVar4 = value->count;
  if (uVar4 != 0) {
    puVar3 = (this->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = input->hash & this->filter_mask;
    if (puVar3[uVar5] + increment < uVar4) {
      puVar3[uVar5] = puVar3[uVar5] + increment;
      return;
    }
    puVar3[this->filter_mask & (value->str_val).hash] = uVar4;
    std::
    _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->lookup_map)._M_h,&value->str_val);
  }
  CopyValue(value,input,aggr_input);
  local_48 = (value->str_val).hash;
  local_58._M_data = *(ApproxTopKValue **)&(value->str_val).str.value;
  uStack_50 = *(undefined4 *)((long)&(value->str_val).str.value + 8);
  uStack_4c = *(undefined4 *)((long)&(value->str_val).str.value + 0xc);
  local_40 = value;
  std::
  _Hashtable<duckdb::ApproxTopKString,std::pair<duckdb::ApproxTopKString_const,std::reference_wrapper<duckdb::ApproxTopKValue>>,std::allocator<std::pair<duckdb::ApproxTopKString_const,std::reference_wrapper<duckdb::ApproxTopKValue>>>,std::__detail::_Select1st,duckdb::ApproxTopKEquality,duckdb::ApproxTopKHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<duckdb::ApproxTopKString,duckdb::ApproxTopKValue&>>
            ((_Hashtable<duckdb::ApproxTopKString,std::pair<duckdb::ApproxTopKString_const,std::reference_wrapper<duckdb::ApproxTopKValue>>,std::allocator<std::pair<duckdb::ApproxTopKString_const,std::reference_wrapper<duckdb::ApproxTopKValue>>>,std::__detail::_Select1st,duckdb::ApproxTopKEquality,duckdb::ApproxTopKHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->lookup_map);
  IncrementCount(this,value,increment);
  return;
}

Assistant:

void InsertOrReplaceEntry(const ApproxTopKString &input, AggregateInputData &aggr_input, idx_t increment = 1) {
		if (values.size() < capacity) {
			D_ASSERT(increment > 0);
			// we can always add this entry
			auto &val = stored_values[values.size()];
			val.index = values.size();
			values.push_back(val);
		}
		auto &value = values.back().get();
		if (value.count > 0) {
			// the capacity is reached - we need to replace an entry

			// we use the filter as an early out
			// based on the hash - we find a slot in the filter
			// instead of monitoring the value immediately, we add to the slot in the filter
			// ONLY when the value in the filter exceeds the current min value, we start monitoring the value
			// this speeds up the algorithm as switching monitor values means we need to erase/insert in the hash table
			auto &filter_value = filter[input.hash & filter_mask];
			if (filter_value + increment < value.count) {
				// if the filter has a lower count than the current min count
				// we can skip adding this entry (for now)
				filter_value += increment;
				return;
			}
			// the filter exceeds the min value - start monitoring this value
			// erase the existing entry from the map
			// and set the filter for the minimum value back to the current minimum value
			filter[value.str_val.hash & filter_mask] = value.count;
			lookup_map.erase(value.str_val);
		}
		CopyValue(value, input, aggr_input);
		lookup_map.insert(make_pair(value.str_val, reference<ApproxTopKValue>(value)));
		IncrementCount(value, increment);
	}